

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int luv_udp_getsockname(lua_State *L)

{
  int iVar1;
  uv_udp_t *handle;
  int in_ESI;
  int addrlen;
  sockaddr_storage address;
  int local_8c;
  sockaddr_storage local_88;
  
  handle = luv_check_udp(L,in_ESI);
  local_8c = 0x80;
  iVar1 = uv_udp_getsockname(handle,(sockaddr *)&local_88,&local_8c);
  if (iVar1 < 0) {
    luv_error(L,iVar1);
    iVar1 = 3;
  }
  else {
    parse_sockaddr(L,&local_88,local_8c);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int luv_udp_getsockname(lua_State* L) {
  uv_udp_t* handle = luv_check_udp(L, 1);
  struct sockaddr_storage address;
  int addrlen = sizeof(address);
  int ret = uv_udp_getsockname(handle, (struct sockaddr*)&address, &addrlen);
  if (ret < 0) return luv_error(L, ret);
  parse_sockaddr(L, &address);
  return 1;
}